

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

bool __thiscall kws::Parser::IsInAnyComments(Parser *this,size_t pos)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  string *psVar4;
  
  psVar4 = &this->m_Buffer;
  uVar2 = std::__cxx11::string::find((char *)psVar4,0x16952a,0);
  if (uVar2 != 0xffffffffffffffff) {
    uVar3 = std::__cxx11::string::find((char *)psVar4,0x169502,uVar2);
    while (uVar3 != 0xffffffffffffffff) {
      if (uVar2 <= pos && pos <= uVar3) {
        return true;
      }
      uVar2 = std::__cxx11::string::find((char *)psVar4,0x16952a,uVar3 + 1);
      if (uVar2 == 0xffffffffffffffff) break;
      uVar3 = std::__cxx11::string::find((char *)psVar4,0x169502,uVar2);
    }
  }
  bVar1 = false;
  uVar2 = std::__cxx11::string::find((char *)psVar4,0x16952d,0);
  if (uVar2 != 0xffffffffffffffff) {
    uVar3 = std::__cxx11::string::find((char *)psVar4,0x169530,uVar2);
    if (uVar3 == 0xffffffffffffffff) {
      bVar1 = false;
    }
    else {
      do {
        bVar1 = uVar2 <= pos && pos <= uVar3;
        if (bVar1) {
          return bVar1;
        }
        uVar2 = std::__cxx11::string::find((char *)psVar4,0x16952d,uVar3 + 1);
        if (uVar2 == 0xffffffffffffffff) {
          return bVar1;
        }
        uVar3 = std::__cxx11::string::find((char *)psVar4,0x169530,uVar2);
      } while (uVar3 != 0xffffffffffffffff);
    }
  }
  return bVar1;
}

Assistant:

bool Parser::IsInAnyComments(size_t pos) const
{
  //Check //
  size_t posslash = m_Buffer.find("//",0);
  size_t posend = std::string::npos;
  if(posslash != std::string::npos)
    {
    posend = m_Buffer.find("\n",posslash);
    }

  while(posend != std::string::npos)
    {
    if(pos<=posend && pos>=posslash)
      {
      return true;
      }
    posslash = m_Buffer.find("//",posend+1);
    if(posslash != std::string::npos)
      {
      posend = m_Buffer.find("\n",posslash);
      }
    else
      {
      posend = std::string::npos;
      }
    }

  // Check the /* */
  size_t posstart = m_Buffer.find("/*",0);
  posend = std::string::npos;
  if(posstart != std::string::npos)
    {
    posend = m_Buffer.find("*/",posstart);
    }

  while(posend != std::string::npos)
    {
    if(pos<=posend && pos>=posstart)
      {
      return true;
      }
    posstart = m_Buffer.find("/*",posend+1);
    if(posstart != std::string::npos)
      {
      posend = m_Buffer.find("*/",posstart);
      }
    else
      {
      posend = std::string::npos;
      }
    }
  return false;
}